

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS
ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_NODE ref_node)

{
  int insert_node;
  REF_DBL *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  uint unaff_R12D;
  REF_LONG ref_private_status_reis_ai;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  REF_INT new_node;
  REF_DBL box [6];
  uint local_88;
  int local_7c;
  REF_NODE local_78;
  REF_DBL *local_70;
  REF_DBL local_68;
  REF_DBL local_60;
  REF_DBL local_58;
  
  local_78 = ref_node;
  local_70 = bbox;
  if (ref_oct->children[node * 8] == -1) {
    uVar5 = 0;
    bVar6 = false;
    do {
      if (ref_oct->nodes[(long)(node * 0x1b) + uVar5] == -1) {
        insert_node = ref_oct->nnode;
        ref_oct->nnode = insert_node + 1;
        uVar3 = ref_node_add(local_78,(long)insert_node,&local_7c);
        if (uVar3 == 0) {
          if (insert_node != local_7c) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x11e,"ref_oct_unique_corner_nodes_node","expects to match",(long)insert_node,
                   (long)local_7c);
            uVar3 = 1;
            goto LAB_0017f6f0;
          }
          RVar2 = ref_oct_bbox_corner(local_70,(REF_INT)uVar5,&local_68);
          if (RVar2 != 0) {
            uVar3 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x11f,"ref_oct_unique_corner_nodes_node",1,"corner xyz");
            goto LAB_0017f6f0;
          }
          pRVar1 = local_78->real;
          lVar4 = (long)local_7c;
          pRVar1[lVar4 * 0xf] = local_68;
          pRVar1[lVar4 * 0xf + 1] = local_60;
          pRVar1[lVar4 * 0xf + 2] = local_58;
          uVar3 = ref_oct_set_node_at(ref_oct,insert_node,&local_68);
          bVar7 = uVar3 == 0;
          if (!bVar7) {
            bVar7 = false;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x123,"ref_oct_unique_corner_nodes_node",(ulong)uVar3,"set node");
            local_88 = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x11d,"ref_oct_unique_corner_nodes_node",(ulong)uVar3,"add node");
LAB_0017f6f0:
          bVar7 = false;
          local_88 = uVar3;
        }
        if (!bVar7) break;
      }
      if (ref_oct->nodes[(long)(node * 0x1b) + uVar5] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x125
               ,"ref_oct_unique_corner_nodes_node","self not set");
        local_88 = 1;
        break;
      }
      bVar6 = 6 < uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 8);
  }
  else {
    bVar6 = false;
    uVar5 = 0;
    do {
      RVar2 = ref_oct_child_bbox(local_70,(REF_INT)uVar5,&local_68);
      if (RVar2 == 0) {
        uVar3 = ref_oct_unique_corner_nodes_node
                          (ref_oct,ref_oct->children[(long)(node * 8) + uVar5],&local_68,local_78);
        bVar7 = uVar3 == 0;
        if (!bVar7) {
          bVar7 = false;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x12f,"ref_oct_unique_corner_nodes_node",(ulong)uVar3,"recurse");
          unaff_R12D = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",299,
               "ref_oct_unique_corner_nodes_node",1,"bbox");
        bVar7 = false;
        unaff_R12D = 1;
      }
      local_88 = unaff_R12D;
      if (!bVar7) break;
      bVar6 = 6 < uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 8);
  }
  if (bVar6) {
    local_88 = 0;
  }
  return local_88;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,
                                                           REF_INT node,
                                                           REF_DBL *bbox,
                                                           REF_NODE ref_node) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    for (corner = 0; corner < 8; corner++) {
      if (REF_EMPTY == ref_oct_c2n(ref_oct, corner, node)) {
        REF_INT new_node;
        REF_DBL xyz[3];
        REF_INT insert_node;
        insert_node = ref_oct_nnode(ref_oct);
        ref_oct_nnode(ref_oct)++;
        RSS(ref_node_add(ref_node, insert_node, &new_node), "add node");
        REIS(insert_node, new_node, "expects to match");
        RSS(ref_oct_bbox_corner(bbox, corner, xyz), "corner xyz");
        ref_node_xyz(ref_node, 0, new_node) = xyz[0];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2];
        RSS(ref_oct_set_node_at(ref_oct, insert_node, xyz), "set node");
      }
      RUS(REF_EMPTY, ref_oct_c2n(ref_oct, corner, node), "self not set");
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_unique_corner_nodes_node(
              ref_oct, ref_oct_child(ref_oct, child_index, node), box,
              ref_node),
          "recurse");
    }
  }
  return REF_SUCCESS;
}